

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O3

optional<helics::ActionMessage> * __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::try_pop(optional<helics::ActionMessage> *__return_storage_ptr__,
         BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  pointer pAVar1;
  int iVar2;
  ActionMessage *pAVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if (iVar2 == 0) {
    pAVar3 = (this->priorityQueue).c.
             super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->priorityQueue).c.
        super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == pAVar3) {
      checkPullAndSwap(this);
      pAVar1 = (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start == pAVar1) {
        (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>).
        _M_payload.super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
        super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
      }
      else {
        helics::ActionMessage::ActionMessage((ActionMessage *)__return_storage_ptr__,pAVar1 + -1);
        (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>).
        _M_payload.super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
        super__Optional_payload_base<helics::ActionMessage>._M_engaged = true;
        pAVar3 = (this->pullElements).
                 super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
        (this->pullElements).
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_finish = pAVar3;
        helics::ActionMessage::~ActionMessage(pAVar3);
        checkPullAndSwap(this);
      }
    }
    else {
      helics::ActionMessage::ActionMessage((ActionMessage *)__return_storage_ptr__,pAVar3);
      (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload
      .super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_engaged = true;
      CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_front
                (&(this->priorityQueue).c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::optional<T> BlockingPriorityQueue<T, MUTEX, COND>::try_pop()
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        if (!priorityQueue.empty()) {
            std::optional<T> val(std::move(priorityQueue.front()));
            priorityQueue.pop();
            return val;
        }
        checkPullAndSwap();
        if (pullElements.empty()) {
            return std::nullopt;
        }
        // do it this way to allow movable only types
        std::optional<T> val(std::move(pullElements.back()));
        pullElements.pop_back();
        checkPullAndSwap();
        return val;
    }